

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicSharedSimple::RunIteration
          (BasicSharedSimple *this,GLuint num_groups,bool dispatch_indirect)

{
  GLuint *buffers;
  CallLogWrapper *this_00;
  GLuint GVar1;
  ulong __n;
  GLuint i;
  ulong uVar2;
  allocator_type local_5d;
  GLuint groups [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  
  __n = (ulong)(num_groups << 8);
  groups[0] = 0xffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&data,__n,groups,&local_5d);
  buffers = &this->m_storage_buffer;
  GVar1 = this->m_storage_buffer;
  if (GVar1 == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,buffers);
    GVar1 = *buffers;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar1);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,__n * 4,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect) {
    groups._4_8_ = &DAT_100000001;
    GVar1 = this->m_dispatch_buffer;
    groups[0] = num_groups;
    if (GVar1 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      GVar1 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,groups,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(this_00,num_groups,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData
            (this_00,0x90d2,0,__n * 4,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  uVar2 = 0;
  do {
    if (__n == uVar2) {
LAB_009c969b:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return __n <= uVar2;
    }
    if (data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] != 1) {
      anon_unknown_0::Output
                ("Data at index %d is %d should be %d.\n",uVar2 & 0xffffffff,
                 (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar2],1);
      goto LAB_009c969b;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool RunIteration(const GLuint num_groups, bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256 * num_groups;

		std::vector<GLuint> data(kBufferSize, 0xffff);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { num_groups, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, &data[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (data[i] != 1)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], 1);
				return false;
			}
		}
		return true;
	}